

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

Vector<kj::CompressionParameters> *
kj::_::findValidExtensionOffers
          (Vector<kj::CompressionParameters> *__return_storage_ptr__,StringPtr offers)

{
  CompressionParameters *pCVar1;
  RemoveConst<kj::CompressionParameters> *pRVar2;
  CompressionParameters *pCVar3;
  RemoveConst<kj::ArrayPtr<const_char>_> *pRVar4;
  ArrayPtr<const_char> *pAVar5;
  RemoveConst<kj::ArrayPtr<const_char>_> *pRVar6;
  ArrayPtr<const_char> *pAVar7;
  undefined2 uVar8;
  undefined1 uVar9;
  int iVar10;
  ushort uVar11;
  ArrayPtr<const_char> *pAVar12;
  size_t newSize;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 in_R8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 aVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  ArrayPtr<const_char> input;
  ArrayPtr<const_char> input_00;
  Vector<kj::CompressionParameters> result;
  Vector<kj::ArrayPtr<const_char>_> extensions;
  Vector<kj::ArrayPtr<const_char>_> splitOffer;
  Vector<kj::CompressionParameters> local_e8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_c8;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_c0;
  Vector<kj::ArrayPtr<const_char>_> local_b8;
  Vector<kj::ArrayPtr<const_char>_> local_98;
  Vector<kj::CompressionParameters> *local_70;
  anon_union_8_1_a8c68091_for_NullableValue<unsigned_long>_2 local_68;
  Maybe<kj::CompressionParameters> local_60;
  
  local_e8.builder.ptr = (CompressionParameters *)0x0;
  local_e8.builder.pos = (CompressionParameters *)0x0;
  local_e8.builder.endPtr = (CompressionParameters *)0x0;
  local_e8.builder.disposer = (ArrayDisposer *)&NullArrayDisposer::instance;
  input.ptr = (char *)(offers.content.size_ - 1);
  input.size_ = 0x2c;
  splitParts(&local_b8,(_ *)offers.content.ptr,input,(char)in_R8.value);
  pRVar4 = local_b8.builder.pos;
  if (local_b8.builder.ptr != local_b8.builder.pos) {
    pAVar12 = local_b8.builder.ptr;
    local_70 = __return_storage_ptr__;
    do {
      input_00.size_ = 0x3b;
      input_00.ptr = (char *)pAVar12->size_;
      splitParts(&local_98,(_ *)pAVar12->ptr,input_00,(char)in_R8.value);
      if ((((local_98.builder.ptr)->size_ == 0x12) &&
          (iVar10 = bcmp((local_98.builder.ptr)->ptr,"permessage-deflate",0x12), iVar10 == 0)) &&
         (tryExtractParameters(&local_60,&local_98,false),
         uVar9 = local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet,
         uVar14 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet,
         uVar8 = local_60.ptr.field_1._0_2_, local_60.ptr.isSet == true)) {
        if (local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet == true) {
          local_c0 = local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.field_1;
          local_60.ptr.field_1.value.outboundMaxWindowBits.ptr.isSet = false;
        }
        if (local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet == true) {
          local_c8 = local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.field_1;
          local_60.ptr.field_1.value.inboundMaxWindowBits.ptr.isSet = false;
        }
        aVar13 = local_c8;
        if ((bool)uVar14 != false) {
          aVar13 = local_c0;
        }
        uVar15 = uVar9;
        if ((bool)uVar9 != false) {
          uVar15 = '\0';
          local_c0 = local_c8;
        }
        if ((bool)uVar14 != false) {
          uVar14 = '\0';
          uVar15 = true;
        }
        if ((bool)uVar9 != false) {
          uVar14 = true;
          local_68 = local_c8;
        }
        local_c8 = aVar13;
        if (local_e8.builder.pos == local_e8.builder.endPtr) {
          newSize = ((long)local_e8.builder.endPtr - (long)local_e8.builder.ptr >> 3) *
                    -0x6666666666666666;
          if (local_e8.builder.endPtr == local_e8.builder.ptr) {
            newSize = 4;
          }
          Vector<kj::CompressionParameters>::setCapacity(&local_e8,newSize);
        }
        uVar11 = uVar8 << 8 | (ushort)uVar8 >> 8;
        (local_e8.builder.pos)->outboundNoContextTakeover = (bool)(char)uVar11;
        (local_e8.builder.pos)->inboundNoContextTakeover = (bool)(char)(uVar11 >> 8);
        ((local_e8.builder.pos)->outboundMaxWindowBits).ptr.isSet = (bool)uVar14;
        if ((bool)uVar14 != false) {
          ((local_e8.builder.pos)->outboundMaxWindowBits).ptr.field_1 = local_c0;
        }
        ((local_e8.builder.pos)->inboundMaxWindowBits).ptr.isSet = (bool)uVar15;
        if ((bool)uVar15 != false) {
          ((local_e8.builder.pos)->inboundMaxWindowBits).ptr.field_1.value = (unsigned_long)local_c8
          ;
        }
        local_e8.builder.pos = local_e8.builder.pos + 1;
        __return_storage_ptr__ = local_70;
        in_R8 = local_c8;
      }
      pAVar7 = local_98.builder.endPtr;
      pRVar6 = local_98.builder.pos;
      pAVar5 = local_98.builder.ptr;
      if (local_98.builder.ptr != (ArrayPtr<const_char> *)0x0) {
        local_98.builder.ptr = (ArrayPtr<const_char> *)0x0;
        local_98.builder.pos = (RemoveConst<kj::ArrayPtr<const_char>_> *)0x0;
        local_98.builder.endPtr = (ArrayPtr<const_char> *)0x0;
        in_R8.value = (long)pAVar7 - (long)pAVar5 >> 4;
        (**(local_98.builder.disposer)->_vptr_ArrayDisposer)
                  (local_98.builder.disposer,pAVar5,0x10,(long)pRVar6 - (long)pAVar5 >> 4,
                   in_R8.value,0);
      }
      pAVar12 = pAVar12 + 1;
    } while (pAVar12 != pRVar4);
  }
  pAVar5 = local_b8.builder.endPtr;
  pRVar4 = local_b8.builder.pos;
  pAVar12 = local_b8.builder.ptr;
  (__return_storage_ptr__->builder).ptr = local_e8.builder.ptr;
  (__return_storage_ptr__->builder).pos = local_e8.builder.pos;
  (__return_storage_ptr__->builder).endPtr = local_e8.builder.endPtr;
  (__return_storage_ptr__->builder).disposer = local_e8.builder.disposer;
  local_e8.builder.ptr = (CompressionParameters *)0x0;
  local_e8.builder.pos = (RemoveConst<kj::CompressionParameters> *)0x0;
  local_e8.builder.endPtr = (CompressionParameters *)0x0;
  if (local_b8.builder.ptr != (ArrayPtr<const_char> *)0x0) {
    local_b8.builder.ptr = (ArrayPtr<const_char> *)0x0;
    local_b8.builder.pos = (ArrayPtr<const_char> *)0x0;
    local_b8.builder.endPtr = (ArrayPtr<const_char> *)0x0;
    (**(local_b8.builder.disposer)->_vptr_ArrayDisposer)
              (local_b8.builder.disposer,pAVar12,0x10,(long)pRVar4 - (long)pAVar12 >> 4,
               (long)pAVar5 - (long)pAVar12 >> 4,0);
  }
  pCVar3 = local_e8.builder.endPtr;
  pRVar2 = local_e8.builder.pos;
  pCVar1 = local_e8.builder.ptr;
  if (local_e8.builder.ptr != (CompressionParameters *)0x0) {
    local_e8.builder.ptr = (CompressionParameters *)0x0;
    local_e8.builder.pos = (RemoveConst<kj::CompressionParameters> *)0x0;
    local_e8.builder.endPtr = (CompressionParameters *)0x0;
    (**(local_e8.builder.disposer)->_vptr_ArrayDisposer)
              (local_e8.builder.disposer,pCVar1,0x28,
               ((long)pRVar2 - (long)pCVar1 >> 3) * -0x3333333333333333,
               ((long)pCVar3 - (long)pCVar1 >> 3) * -0x3333333333333333,
               ArrayDisposer::Dispose_<kj::CompressionParameters>::destruct);
  }
  return __return_storage_ptr__;
}

Assistant:

kj::Vector<CompressionParameters> findValidExtensionOffers(StringPtr offers) {
  // A function to be called by the client that wants to offer extensions through
  // `Sec-WebSocket-Extensions`. This function takes the value of the header (a string) and
  // populates a Vector of all the valid offers.
  kj::Vector<CompressionParameters> result;

  auto extensions = splitParts(offers, ',');

  for (const auto& offer : extensions) {
    auto splitOffer = splitParts(offer, ';');
    if (splitOffer.front() != "permessage-deflate"_kj) {
      continue;
    }
    KJ_IF_SOME(validated, tryExtractParameters(splitOffer, false)) {
      // We need to swap the inbound/outbound properties since `tryExtractParameters` thinks we're
      // parsing as the server (`isAgreement` is false).
      auto tempCtx = validated.inboundNoContextTakeover;
      validated.inboundNoContextTakeover = validated.outboundNoContextTakeover;
      validated.outboundNoContextTakeover = tempCtx;
      auto tempWindow = validated.inboundMaxWindowBits;
      validated.inboundMaxWindowBits = validated.outboundMaxWindowBits;
      validated.outboundMaxWindowBits = tempWindow;
      result.add(kj::mv(validated));
    }
  }

  return kj::mv(result);
}